

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_sort(fy_node *fyn,fy_node_mapping_sort_fn key_cmp,void *arg)

{
  byte bVar1;
  int iVar2;
  fy_token *pfVar3;
  fy_token *pfVar4;
  
  iVar2 = 0;
  if (fyn != (fy_node *)0x0) {
    bVar1 = fyn->field_0x34 & 3;
    if (bVar1 == 2) {
      iVar2 = fy_node_mapping_sort(fyn,key_cmp,arg);
      if (iVar2 == 0) {
        pfVar4 = (fyn->field_12).scalar;
        iVar2 = 0;
        if (pfVar4 != (fy_token *)0x0 && pfVar4 != (fy_token *)&fyn->field_12) {
          do {
            pfVar3 = (fy_token *)(pfVar4->node).next;
            if (pfVar3 == (fy_token *)&fyn->field_12) {
              pfVar3 = (fy_token *)0x0;
            }
            iVar2 = fy_node_sort(*(fy_node **)&pfVar4->type,key_cmp,arg);
            if (iVar2 != 0) {
              return iVar2;
            }
            iVar2 = fy_node_sort(*(fy_node **)&pfVar4->analyze_flags,key_cmp,arg);
            if (iVar2 != 0) {
              return iVar2;
            }
            pfVar4->text = (char *)fyn;
            iVar2 = 0;
            pfVar4 = pfVar3;
          } while (pfVar3 != (fy_token *)0x0);
        }
      }
    }
    else if (bVar1 == 1) {
      pfVar4 = (fyn->field_12).scalar;
      if (pfVar4 != (fy_token *)0x0 && pfVar4 != (fy_token *)&fyn->field_12) {
        do {
          fy_node_sort((fy_node *)pfVar4,key_cmp,arg);
          pfVar3 = (fy_token *)(pfVar4->node).next;
          iVar2 = 0;
          pfVar4 = (fy_token *)0x0;
          if (pfVar3 != (fy_token *)&fyn->field_12) {
            pfVar4 = pfVar3;
          }
        } while (pfVar4 != (fy_token *)0x0);
      }
    }
  }
  return iVar2;
}

Assistant:

int fy_node_sort(struct fy_node *fyn, fy_node_mapping_sort_fn key_cmp, void *arg) {
    struct fy_node *fyni;
    struct fy_node_pair *fynp, *fynpi;
    int ret;

    if (!fyn)
        return 0;

    switch (fyn->type) {
        case FYNT_SCALAR:
            break;

        case FYNT_SEQUENCE:
            for (fyni = fy_node_list_head(&fyn->sequence); fyni;
                 fyni = fy_node_next(&fyn->sequence, fyni)) {

                fy_node_sort(fyni, key_cmp, arg);
            }
            break;

        case FYNT_MAPPING:
            ret = fy_node_mapping_sort(fyn, key_cmp, arg);
            if (ret)
                return ret;

            for (fynp = fy_node_pair_list_head(&fyn->mapping); fynp; fynp = fynpi) {

                fynpi = fy_node_pair_next(&fyn->mapping, fynp);

                /* the parent of the key is always NULL */
                ret = fy_node_sort(fynp->key, key_cmp, arg);
                if (ret)
                    return ret;

                ret = fy_node_sort(fynp->value, key_cmp, arg);
                if (ret)
                    return ret;

                fynp->parent = fyn;
            }
            break;
    }

    return 0;
}